

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_selftest(void)

{
  int iVar1;
  undefined1 *data;
  uint uVar2;
  char *pcVar3;
  uchar out [32];
  secp256k1_sha256 local_78;
  
  local_78.s[0] = 0x6a09e667;
  local_78.s[1] = 0xbb67ae85;
  local_78.s[2] = 0x3c6ef372;
  local_78.s[3] = 0xa54ff53a;
  local_78.s[4] = 0x510e527f;
  local_78.s[5] = 0x9b05688c;
  local_78.s[6] = 0x1f83d9ab;
  local_78.s[7] = 0x5be0cd19;
  local_78.bytes = 0;
  secp256k1_sha256_write
            (&local_78,(uchar *)"For this sample, this 63-byte string will be used as input data",
             0x3f);
  secp256k1_sha256_finalize(&local_78,out);
  data = secp256k1_selftest_sha256_output32;
  iVar1 = secp256k1_memcmp_var(out,secp256k1_selftest_sha256_output32,0x20);
  if (iVar1 == 0) {
    return;
  }
  uVar2 = 0x110494;
  secp256k1_default_error_callback_fn("self test failed",data);
  if ((char)uVar2 == '\x01') {
    if ((uVar2 >> 10 & 1) == 0) {
      return;
    }
  }
  else {
    secp256k1_default_illegal_callback_fn("Invalid flags",data);
  }
  pcVar3 = "Declassify flag requires running with memory checking";
  secp256k1_default_illegal_callback_fn
            ("Declassify flag requires running with memory checking",data);
  if (*(int *)pcVar3 != 0) {
    return;
  }
  (**(code **)((long)pcVar3 + 0xa8))
            ("secp256k1_context_is_proper(ctx)",*(undefined8 *)((long)pcVar3 + 0xb0));
  return;
}

Assistant:

void secp256k1_selftest(void) {
    if (!secp256k1_selftest_passes()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }
}